

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char encode(char input)

{
  int iVar1;
  undefined1 local_9;
  char input_local;
  
  if ((input < 'A') || ('Z' < input)) {
    if (input == ' ') {
      iVar1 = rand();
      local_9 = (char)(iVar1 % 10) + '0';
    }
    else {
      local_9 = '-';
    }
  }
  else if (input == 'E') {
    local_9 = ' ';
  }
  else if ((int)input % 2 == 0) {
    if (input + 4 < 0x5b) {
      local_9 = input + '\x04';
    }
    else {
      local_9 = input + -0x16;
    }
  }
  else if (input + 6 < 0x5b) {
    local_9 = input + '\x06';
  }
  else {
    local_9 = input + -0x14;
  }
  return local_9;
}

Assistant:

char encode(const char input) {
  if (input >= 'A' && input <= 'Z') {
    if (input == 'E') return ' ';
    if (input % 2) {
      return input + 6 <= 'Z' ? input + 6 : input - 20;
    } else {
      return input + 4 <= 'Z' ? input + 4 : input - 22;
    }
  }
  if (input == ' ') return '0' + (char)(rand() % 10);
  else return '-';
}